

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall mjs::parser::check_function_name(parser *this,wstring_view id,source_extend *extend)

{
  bool bVar1;
  wostream *pwVar2;
  wstring_view *s;
  wchar_t *in_R9;
  wstring_view name;
  wstring_view message;
  wostringstream _oss;
  wstring local_1b8;
  mjs *local_198;
  wchar_t *local_190;
  wostringstream local_188 [376];
  
  name._M_str = id._M_str;
  local_198 = (mjs *)id._M_len;
  name._M_len = (size_t)name._M_str;
  local_190 = name._M_str;
  bVar1 = is_strict_mode_unassignable_identifier(local_198,name);
  if (!bVar1) {
    return;
  }
  std::__cxx11::wostringstream::wostringstream(local_188);
  pwVar2 = std::operator<<((wostream *)local_188,"\"");
  cpp_quote_abi_cxx11_(&local_1b8,(mjs *)&local_198,s);
  pwVar2 = std::operator<<(pwVar2,(wstring *)&local_1b8);
  std::operator<<(pwVar2,"\" may not be used as a function name in strict mode");
  std::__cxx11::wstring::~wstring((wstring *)&local_1b8);
  std::__cxx11::wstringbuf::str();
  message._M_str = in_R9;
  message._M_len = (size_t)local_1b8._M_dataplus._M_p;
  syntax_error((parser *)"check_function_name",(char *)0x2a9,(int)extend,
               (source_extend *)local_1b8._M_string_length,message);
}

Assistant:

void check_function_name(const std::wstring_view id, const source_extend& extend) {
        if (is_strict_mode_unassignable_identifier(id)) {
            SYNTAX_ERROR_AT("\"" << cpp_quote(id) << "\" may not be used as a function name in strict mode", extend);
        }
    }